

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler
          (char *name,xmlCharEncodingInputFunc input,xmlCharEncodingOutputFunc output)

{
  __int32_t _Var1;
  __int32_t *p_Var2;
  char *pcVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  xmlCharEncodingHandlerPtr handler;
  char upper [500];
  char local_218 [504];
  
  pcVar3 = xmlGetEncodingAlias(name);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = name;
  }
  if (pcVar3 != (char *)0x0) {
    pp_Var4 = __ctype_toupper_loc();
    p_Var2 = *pp_Var4;
    uVar5 = 0;
    do {
      _Var1 = p_Var2[(byte)pcVar3[uVar5]];
      local_218[uVar5] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_0012956d;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 499);
    uVar5 = 499;
LAB_0012956d:
    local_218[uVar5 & 0xffffffff] = '\0';
    pcVar3 = (*xmlMemStrdup)(local_218);
    if (pcVar3 != (char *)0x0) {
      handler = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x38);
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        handler->ctxtDtor = (xmlCharEncConvCtxtDtor)0x0;
        *(undefined8 *)&handler->flags = 0;
        handler->inputCtxt = (void *)0x0;
        handler->outputCtxt = (void *)0x0;
        (handler->input).legacyFunc = input;
        (handler->output).legacyFunc = output;
        handler->name = pcVar3;
        handler->flags = 3;
        xmlRegisterCharEncodingHandler(handler);
        return handler;
      }
      (*xmlFree)(pcVar3);
    }
  }
  return (xmlCharEncodingHandlerPtr)0x0;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler(const char *name,
                          xmlCharEncodingInputFunc input,
                          xmlCharEncodingOutputFunc output) {
    xmlCharEncodingHandlerPtr handler;
    const char *alias;
    char upper[500];
    int i;
    char *up = NULL;

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    /*
     * Keep only the uppercase version of the encoding.
     */
    if (name == NULL)
	return(NULL);
    for (i = 0;i < 499;i++) {
        upper[i] = (char) toupper((unsigned char) name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;
    up = xmlMemStrdup(upper);
    if (up == NULL)
	return(NULL);

    /*
     * allocate and fill-up an handler block.
     */
    handler = (xmlCharEncodingHandlerPtr)
              xmlMalloc(sizeof(xmlCharEncodingHandler));
    if (handler == NULL) {
        xmlFree(up);
	return(NULL);
    }
    memset(handler, 0, sizeof(xmlCharEncodingHandler));
    handler->input.legacyFunc = input;
    handler->output.legacyFunc = output;
    handler->name = up;
    handler->flags = XML_HANDLER_STATIC | XML_HANDLER_LEGACY;

    /*
     * registers and returns the handler.
     */
    xmlRegisterCharEncodingHandler(handler);
    return(handler);
}